

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

QAccessibleInterface * __thiscall
QAccessibleComboBox::childAt(QAccessibleComboBox *this,int x,int y)

{
  bool bVar1;
  QComboBox *this_00;
  QWidget *this_01;
  QAccessibleInterface *pQVar2;
  long in_FS_OFFSET;
  QRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = comboBox(this);
  if (this_00 != (QComboBox *)0x0) {
    bVar1 = QComboBox::isEditable(this_00);
    if (bVar1) {
      this_01 = &QComboBox::lineEdit(this_00)->super_QWidget;
      local_38 = QWidget::rect(this_01);
      bVar1 = QRect::contains(&local_38,x,y);
      if (bVar1) {
        pQVar2 = (QAccessibleInterface *)
                 (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x48))(this,1);
        goto LAB_004cb707;
      }
    }
  }
  pQVar2 = (QAccessibleInterface *)0x0;
LAB_004cb707:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleComboBox::childAt(int x, int y) const
{
    if (QComboBox *cBox = comboBox()) {
        if (cBox->isEditable() && cBox->lineEdit()->rect().contains(x, y))
            return child(1);
    }
    return nullptr;
}